

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_mrm(ASMState *as,x86Op xo,Reg rr,Reg rb)

{
  byte bVar1;
  int32_t *piVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  int32_t *piStack_88;
  x86Mode mode;
  MCode *p;
  Reg rb_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex_1;
  int n_1;
  byte *local_40;
  byte local_34;
  uint32_t rex;
  int n;
  byte *local_10;
  
  piVar2 = (int32_t *)as->mcp;
  cVar3 = -0x40;
  bVar4 = (byte)(xo >> 8);
  local_34 = (byte)(rr >> 0x10);
  piStack_88 = piVar2;
  p._4_4_ = rb;
  if (rb == 0x20) {
    p._4_4_ = (Reg)(as->mrm).base;
    if (p._4_4_ == 0x80) {
      p._4_4_ = 5;
      cVar3 = '\0';
      piStack_88 = piVar2 + -1;
      *piStack_88 = (as->mrm).ofs;
      if ((as->mrm).idx != 0x80) {
LAB_001850a9:
        *(byte *)((long)piStack_88 + -1) =
             (as->mrm).scale + ((as->mrm).idx & 7) * '\b' + ((byte)p._4_4_ & 7);
        *(MCode *)((long)piStack_88 + -2) = cVar3 + (char)((rr & 7) << 3) + '\x04';
        bVar1 = (as->mrm).idx;
        iVar5 = (int)(char)xo;
        if (iVar5 == -0x3c) {
          *(x86Op *)((long)piStack_88 + -6) =
               ((rr >> 1 & 4) + (bVar1 >> 2 & 2) + (p._4_4_ >> 3 & 1)) * 0x2000 ^ xo;
          local_10 = (byte *)((long)piStack_88 + -6);
        }
        else {
          *(x86Op *)((long)piStack_88 + -6) = xo;
          pbVar7 = (byte *)((long)piStack_88 + (long)(iVar5 + -1));
          iVar6 = (rr >> 1 & 0x104) + 0x40 + (bVar1 >> 2 & 2) + (p._4_4_ >> 3 & 1);
          _n = pbVar7;
          if (iVar6 != 0x40) {
            local_34 = local_34 | (byte)iVar6;
            if (iVar5 == -4) {
              *pbVar7 = local_34;
              local_34 = bVar4;
            }
            else if ((xo & 0xffffff) == 0x6600fd) {
              *pbVar7 = local_34;
              local_34 = 0x66;
            }
            _n = pbVar7 + -1;
            pbVar7[-1] = local_34;
          }
          local_10 = _n;
        }
        as->mcp = local_10;
        return;
      }
      *(MCode *)((long)piVar2 + -5) = '%';
      p._4_4_ = 4;
      piStack_88 = (int32_t *)((long)piVar2 + -5);
    }
    else if (p._4_4_ == 0x25) {
      cVar3 = '\0';
      piVar2[-1] = (as->mrm).ofs;
      piStack_88 = piVar2 + -1;
    }
    else {
      if (((as->mrm).ofs == 0) && ((p._4_4_ & 7) != 5)) {
        cVar3 = '\0';
      }
      else if ((as->mrm).ofs == (int)(char)(as->mrm).ofs) {
        piStack_88 = (int32_t *)((long)piVar2 + -1);
        *(MCode *)((long)piVar2 + -1) = (MCode)(as->mrm).ofs;
        cVar3 = '@';
      }
      else {
        piStack_88 = piVar2 + -1;
        *piStack_88 = (as->mrm).ofs;
        cVar3 = -0x80;
      }
      if ((as->mrm).idx != 0x80) goto LAB_001850a9;
      if ((p._4_4_ & 7) == 4) {
        *(MCode *)((long)piStack_88 + -1) = '$';
        piStack_88 = (int32_t *)((long)piStack_88 + -1);
      }
    }
  }
  *(byte *)((long)piStack_88 + -1) = cVar3 + (char)((rr & 7) << 3) + ((byte)p._4_4_ & 7);
  iVar5 = (int)(char)xo;
  if (iVar5 == -0x3c) {
    *(x86Op *)((long)piStack_88 + -5) = ((rr >> 1 & 4) + (p._4_4_ >> 3 & 1)) * 0x2000 ^ xo;
    local_40 = (byte *)((long)piStack_88 + -5);
  }
  else {
    *(x86Op *)((long)piStack_88 + -5) = xo;
    pbVar7 = (byte *)((long)piStack_88 + (long)iVar5);
    iVar6 = (rr >> 1 & 0x104) + 0x40 + (p._4_4_ >> 3 & 1);
    _n_1 = pbVar7;
    if (iVar6 != 0x40) {
      as_local._4_1_ = local_34 | (byte)iVar6;
      if (iVar5 == -4) {
        *pbVar7 = as_local._4_1_;
        as_local._4_1_ = bVar4;
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar7 = as_local._4_1_;
        as_local._4_1_ = 0x66;
      }
      _n_1 = pbVar7 + -1;
      pbVar7[-1] = as_local._4_1_;
    }
    local_40 = _n_1;
  }
  as->mcp = local_40;
  return;
}

Assistant:

static void emit_mrm(ASMState *as, x86Op xo, Reg rr, Reg rb)
{
  MCode *p = as->mcp;
  x86Mode mode = XM_REG;
  if (rb == RID_MRM) {
    rb = as->mrm.base;
    if (rb == RID_NONE) {
      rb = RID_EBP;
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
      if (as->mrm.idx != RID_NONE)
	goto mrmidx;
#if LJ_64
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
      rb = RID_ESP;
#endif
    } else if (LJ_GC64 && rb == RID_RIP) {
      lj_assertA(as->mrm.idx == RID_NONE, "RIP-rel mrm cannot have index");
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
    } else {
      if (as->mrm.ofs == 0 && (rb&7) != RID_EBP) {
	mode = XM_OFS0;
      } else if (checki8(as->mrm.ofs)) {
	*--p = (MCode)as->mrm.ofs;
	mode = XM_OFS8;
      } else {
	p -= 4;
	*(int32_t *)p = as->mrm.ofs;
	mode = XM_OFS32;
      }
      if (as->mrm.idx != RID_NONE) {
      mrmidx:
	as->mcp = emit_opmx(xo, mode, as->mrm.scale, rr, rb, as->mrm.idx, p);
	return;
      }
      if ((rb&7) == RID_ESP)
	*--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
    }
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}